

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* helics::CoreFactory::getAvailableCoreTypes_abi_cxx11_(void)

{
  size_t sVar1;
  string *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t ii;
  size_t index;
  
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = MasterCoreBuilder::size();
  for (index = 0; sVar1 != index; index = index + 1) {
    __x = MasterCoreBuilder::getIndexedBuilderName_abi_cxx11_(index);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDI,(value_type *)__x);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> getAvailableCoreTypes()
{
    std::vector<std::string> availableCores;
    auto builderCount = MasterCoreBuilder::size();
    for (size_t ii = 0; ii < builderCount; ++ii) {
        availableCores.push_back(MasterCoreBuilder::getIndexedBuilderName(ii));
    }
    return availableCores;
}